

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickrst.c
# Opt level: O2

void search_sgrproj(RestorationTileLimits *limits,int rest_unit_idx,void *priv,int32_t *tmpbuf,
                   RestorationLineBuffers *rlbs,aom_internal_error_info *error_info)

{
  SgrprojInfo *ref_sgrproj_info;
  int src_stride;
  uint uVar1;
  SgrprojInfo *sgrproj_info;
  RestSearchCtxt *pRVar2;
  int iVar3;
  int iVar4;
  int64_t iVar5;
  ulong uVar6;
  byte bVar7;
  uint uVar8;
  long lVar9;
  uint uVar10;
  long lVar11;
  int iVar12;
  bool bVar13;
  bool bVar14;
  double dVar15;
  double dVar16;
  int64_t err;
  uint8_t *local_100;
  uint8_t *local_f8;
  ulong local_f0;
  int32_t *local_e8;
  ulong local_e0;
  ulong local_d8;
  ulong local_d0;
  ulong local_c8;
  int32_t *local_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  RestorationTileLimits *local_a8;
  long local_a0;
  SgrprojInfo *local_98;
  ulong local_90;
  long local_88;
  RestSearchCtxt *local_80;
  RestorationUnitInfo rui;
  
  local_a0 = *(long *)((long)priv + 0x18);
  local_90 = (ulong)*(int *)(local_a0 + 0xb944);
  local_88 = (long)rest_unit_idx * 0x40 + *(long *)((long)priv + 0x30);
  if (*(char *)((long)priv + 0x78) == '\0') {
    lVar9 = *(long *)(*(long *)((long)priv + 0x10) + 0x6088);
    iVar3 = limits->v_start;
    iVar4 = *(int *)((long)priv + 0x48);
    src_stride = *(int *)((long)priv + 0x58);
    iVar12 = limits->h_start;
    if (*(int *)((long)priv + 0x20) < 1) {
      bVar13 = false;
      bVar14 = false;
    }
    else {
      bVar13 = *(int *)(lVar9 + 0x60) != 0;
      bVar14 = *(int *)(lVar9 + 100) != 0;
    }
    local_c8 = (ulong)*(byte *)(lVar9 + 0x4c);
    local_f0 = (ulong)*(uint *)(lVar9 + 0x48);
    local_f8 = (uint8_t *)((long)(iVar4 * iVar3) + *(long *)((long)priv + 0x40) + (long)iVar12);
    local_100 = (uint8_t *)
                ((long)(src_stride * iVar3) + *(long *)((long)priv + 0x50) + (long)iVar12);
    local_d8 = (ulong)(0x40 >> bVar13);
    local_d0 = (ulong)(0x40 >> bVar14);
    local_98 = (SgrprojInfo *)(local_88 + 0x20);
    uVar8 = limits->h_end - iVar12;
    local_e0 = (ulong)uVar8;
    iVar3 = limits->v_end - iVar3;
    iVar12 = (uVar8 + 7 & 0xfffffff8) + 8;
    local_e8 = tmpbuf + 0x27734;
    local_c0 = tmpbuf;
    local_a8 = limits;
    local_80 = (RestSearchCtxt *)priv;
    if (*(int *)(*(long *)((long)priv + 0x38) + 0x18) == 0) {
      local_b8 = 0;
      uStack_b0 = 0;
      lVar9 = -1;
      uVar6 = 0;
      for (uVar8 = 0; uVar8 != 0x10; uVar8 = uVar8 + 1) {
        compute_sgrproj_err(local_f8,(int)local_e0,iVar3,iVar4,local_100,src_stride,(int)local_c8,
                            (int)local_f0,(int)local_d8,(int)local_d0,uVar8,local_c0,local_e8,iVar12
                            ,(int *)&rui,&err,error_info);
        if (err < lVar9 || lVar9 == -1) {
          local_b8 = CONCAT44(rui._4_4_,rui.restoration_type);
          uStack_b0 = 0;
          uVar10 = uVar8;
          lVar9 = err;
        }
        else {
          uVar10 = (uint)uVar6;
        }
        uVar6 = (ulong)uVar10;
      }
    }
    else {
      local_b8 = 0;
      uStack_b0 = 0;
      lVar9 = -1;
      uVar6 = 0;
      for (lVar11 = 0; uVar8 = (uint)uVar6, lVar11 != 0x10; lVar11 = lVar11 + 4) {
        uVar10 = *(uint *)((long)sgproj_ep_grp1_seed + lVar11);
        compute_sgrproj_err(local_f8,(int)local_e0,iVar3,iVar4,local_100,src_stride,(int)local_c8,
                            (int)local_f0,(int)local_d8,(int)local_d0,uVar10,local_c0,local_e8,
                            iVar12,(int *)&rui,&err,error_info);
        if (err < lVar9 || lVar9 == -1) {
          local_b8 = CONCAT44(rui._4_4_,rui.restoration_type);
          uStack_b0 = 0;
          uVar8 = uVar10;
          lVar9 = err;
        }
        uVar6 = (ulong)uVar8;
      }
      for (uVar10 = uVar8 - 1; (int)uVar10 < (int)(uVar8 + 2); uVar10 = uVar10 + 2) {
        if (uVar10 < 10) {
          compute_sgrproj_err(local_f8,(int)local_e0,iVar3,iVar4,local_100,src_stride,(int)local_c8,
                              (int)local_f0,(int)local_d8,(int)local_d0,uVar10,local_c0,local_e8,
                              iVar12,(int *)&rui,&err,error_info);
          if (err < lVar9 || lVar9 == -1) {
            local_b8 = CONCAT44(rui._4_4_,rui.restoration_type);
            uStack_b0 = 0;
            uVar1 = uVar10;
            lVar9 = err;
          }
          else {
            uVar1 = (uint)uVar6;
          }
          uVar6 = (ulong)uVar1;
        }
      }
      for (lVar11 = 0; lVar11 != 0x70; lVar11 = lVar11 + 0x38) {
        uVar8 = *(uint *)((long)sgproj_ep_grp2_3[0] + (long)(int)uVar6 * 4 + lVar11);
        compute_sgrproj_err(local_f8,(int)local_e0,iVar3,iVar4,local_100,src_stride,(int)local_c8,
                            (int)local_f0,(int)local_d8,(int)local_d0,uVar8,local_c0,local_e8,iVar12
                            ,(int *)&rui,&err,error_info);
        if (err < lVar9 || lVar9 == -1) {
          uVar6 = (ulong)uVar8;
          local_b8 = CONCAT44(rui._4_4_,rui.restoration_type);
          uStack_b0 = 0;
          lVar9 = err;
        }
      }
    }
    pRVar2 = local_80;
    lVar11 = local_88;
    sgrproj_info = local_98;
    *(ulong *)(local_88 + 0x20) = uVar6 | local_b8 << 0x20;
    *(undefined4 *)(local_88 + 0x28) = local_b8._4_4_;
    rui.restoration_type = RESTORE_SGRPROJ;
    rui.sgrproj_info.ep = local_98->ep;
    rui.sgrproj_info.xqd[0] = local_98->xqd[0];
    rui.sgrproj_info.xqd[1] = local_98->xqd[1];
    iVar5 = try_restoration_unit(local_80,local_a8,&rui);
    lVar9 = local_a0;
    pRVar2->sse[2] = iVar5;
    iVar3 = *(int *)(local_a0 + 0xb948);
    ref_sgrproj_info = &pRVar2->ref_sgrproj;
    iVar4 = count_sgrproj_bits(sgrproj_info,ref_sgrproj_info);
    uVar6 = (long)(iVar4 << 9) + (long)iVar3;
    bVar7 = (char)local_f0 * '\x02' - 0x10;
    dVar15 = (double)(pRVar2->sse[0] >> (bVar7 & 0x3f)) * 128.0 +
             (double)(int)(local_90 >> 4) * (double)*(int *)(lVar9 + 0x4218) * 0.001953125;
    dVar16 = (double)(pRVar2->sse[2] >> (bVar7 & 0x3f)) * 128.0 +
             (double)(int)(uVar6 >> 4) * (double)*(int *)(lVar9 + 0x4218) * 0.001953125;
    if (*(int *)(lVar11 + 0x20) < 10) {
      dVar16 = dVar16 * ((double)pRVar2->lpf_sf->dual_sgr_penalty_level * 0.01 + 1.0);
    }
    if (dVar16 < dVar15) {
      local_90 = uVar6;
    }
    *(uint *)(lVar11 + 0x30) = (uint)(dVar16 < dVar15) * 2;
    pRVar2->total_sse[2] = pRVar2->total_sse[2] + pRVar2->sse[(ulong)(dVar16 < dVar15) * 2];
    pRVar2->total_bits[2] = pRVar2->total_bits[2] + local_90;
    if (dVar16 < dVar15) {
      (pRVar2->ref_sgrproj).xqd[1] = sgrproj_info->xqd[1];
      iVar3 = sgrproj_info->xqd[0];
      ref_sgrproj_info->ep = sgrproj_info->ep;
      ref_sgrproj_info->xqd[0] = iVar3;
    }
  }
  else {
    *(long *)((long)priv + 0xb0) = *(long *)((long)priv + 0xb0) + local_90;
    *(long *)((long)priv + 0x90) = *(long *)((long)priv + 0x90) + *(long *)((long)priv + 0x60);
    *(undefined4 *)(local_88 + 0x30) = 0;
    *(undefined8 *)((long)priv + 0x70) = 0x7fffffffffffffff;
  }
  return;
}

Assistant:

static inline void search_sgrproj(const RestorationTileLimits *limits,
                                  int rest_unit_idx, void *priv,
                                  int32_t *tmpbuf, RestorationLineBuffers *rlbs,
                                  struct aom_internal_error_info *error_info) {
  (void)rlbs;
  RestSearchCtxt *rsc = (RestSearchCtxt *)priv;
  RestUnitSearchInfo *rusi = &rsc->rusi[rest_unit_idx];

  const MACROBLOCK *const x = rsc->x;
  const AV1_COMMON *const cm = rsc->cm;
  const int highbd = cm->seq_params->use_highbitdepth;
  const int bit_depth = cm->seq_params->bit_depth;

  const int64_t bits_none = x->mode_costs.sgrproj_restore_cost[0];
  // Prune evaluation of RESTORE_SGRPROJ if 'skip_sgr_eval' is set
  if (rsc->skip_sgr_eval) {
    rsc->total_bits[RESTORE_SGRPROJ] += bits_none;
    rsc->total_sse[RESTORE_SGRPROJ] += rsc->sse[RESTORE_NONE];
    rusi->best_rtype[RESTORE_SGRPROJ - 1] = RESTORE_NONE;
    rsc->sse[RESTORE_SGRPROJ] = INT64_MAX;
    return;
  }

  uint8_t *dgd_start =
      rsc->dgd_buffer + limits->v_start * rsc->dgd_stride + limits->h_start;
  const uint8_t *src_start =
      rsc->src_buffer + limits->v_start * rsc->src_stride + limits->h_start;

  const int is_uv = rsc->plane > 0;
  const int ss_x = is_uv && cm->seq_params->subsampling_x;
  const int ss_y = is_uv && cm->seq_params->subsampling_y;
  const int procunit_width = RESTORATION_PROC_UNIT_SIZE >> ss_x;
  const int procunit_height = RESTORATION_PROC_UNIT_SIZE >> ss_y;

  rusi->sgrproj = search_selfguided_restoration(
      dgd_start, limits->h_end - limits->h_start,
      limits->v_end - limits->v_start, rsc->dgd_stride, src_start,
      rsc->src_stride, highbd, bit_depth, procunit_width, procunit_height,
      tmpbuf, rsc->lpf_sf->enable_sgr_ep_pruning, error_info);

  RestorationUnitInfo rui;
  rui.restoration_type = RESTORE_SGRPROJ;
  rui.sgrproj_info = rusi->sgrproj;

  rsc->sse[RESTORE_SGRPROJ] = try_restoration_unit(rsc, limits, &rui);

  const int64_t bits_sgr =
      x->mode_costs.sgrproj_restore_cost[1] +
      (count_sgrproj_bits(&rusi->sgrproj, &rsc->ref_sgrproj)
       << AV1_PROB_COST_SHIFT);
  double cost_none = RDCOST_DBL_WITH_NATIVE_BD_DIST(
      x->rdmult, bits_none >> 4, rsc->sse[RESTORE_NONE], bit_depth);
  double cost_sgr = RDCOST_DBL_WITH_NATIVE_BD_DIST(
      x->rdmult, bits_sgr >> 4, rsc->sse[RESTORE_SGRPROJ], bit_depth);
  if (rusi->sgrproj.ep < 10)
    cost_sgr *=
        (1 + DUAL_SGR_PENALTY_MULT * rsc->lpf_sf->dual_sgr_penalty_level);

  RestorationType rtype =
      (cost_sgr < cost_none) ? RESTORE_SGRPROJ : RESTORE_NONE;
  rusi->best_rtype[RESTORE_SGRPROJ - 1] = rtype;

#if DEBUG_LR_COSTING
  // Store ref params for later checking
  lr_ref_params[RESTORE_SGRPROJ][rsc->plane][rest_unit_idx].sgrproj_info =
      rsc->ref_sgrproj;
#endif  // DEBUG_LR_COSTING

  rsc->total_sse[RESTORE_SGRPROJ] += rsc->sse[rtype];
  rsc->total_bits[RESTORE_SGRPROJ] +=
      (cost_sgr < cost_none) ? bits_sgr : bits_none;
  if (cost_sgr < cost_none) rsc->ref_sgrproj = rusi->sgrproj;
}